

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention_x86_fma::destroy_pipeline(MultiHeadAttention_x86_fma *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),in_RSI);
    if (*(long **)(in_RDI + 8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 8) + 8))();
    }
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))(*(long **)(in_RDI + 0x10),in_RSI);
    if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x10) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x18) + 0x28))(*(long **)(in_RDI + 0x18),in_RSI);
    if (*(long **)(in_RDI + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x18) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))(*(long **)(in_RDI + 0x28),in_RSI);
    if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x28) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x30) + 0x28))(*(long **)(in_RDI + 0x30),in_RSI);
    if (*(long **)(in_RDI + 0x30) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x28))(*(long **)(in_RDI + 0x38),in_RSI);
    if (*(long **)(in_RDI + 0x38) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x20) + 0x28))(*(long **)(in_RDI + 0x20),in_RSI);
    if (*(long **)(in_RDI + 0x20) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x20) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86_fma::destroy_pipeline(const Option& opt)
{
    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    return 0;
}